

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O1

tm * FIX::time_localtime(tm *__return_storage_ptr__,time_t *t)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  tm *ptVar11;
  tm result;
  tm local_40;
  
  ptVar11 = localtime_r(t,&local_40);
  iVar2 = ptVar11->tm_min;
  iVar3 = ptVar11->tm_hour;
  iVar4 = ptVar11->tm_mday;
  iVar5 = ptVar11->tm_mon;
  iVar6 = ptVar11->tm_year;
  iVar7 = ptVar11->tm_wday;
  iVar8 = ptVar11->tm_yday;
  iVar9 = ptVar11->tm_isdst;
  uVar10 = *(undefined4 *)&ptVar11->field_0x24;
  lVar1 = ptVar11->tm_gmtoff;
  __return_storage_ptr__->tm_sec = ptVar11->tm_sec;
  __return_storage_ptr__->tm_min = iVar2;
  __return_storage_ptr__->tm_hour = iVar3;
  __return_storage_ptr__->tm_mday = iVar4;
  __return_storage_ptr__->tm_mon = iVar5;
  __return_storage_ptr__->tm_year = iVar6;
  __return_storage_ptr__->tm_wday = iVar7;
  __return_storage_ptr__->tm_yday = iVar8;
  __return_storage_ptr__->tm_isdst = iVar9;
  *(undefined4 *)&__return_storage_ptr__->field_0x24 = uVar10;
  __return_storage_ptr__->tm_gmtoff = lVar1;
  __return_storage_ptr__->tm_zone = ptVar11->tm_zone;
  return __return_storage_ptr__;
}

Assistant:

tm time_localtime(const time_t *t) {
#ifdef _MSC_VER
#if (_MSC_VER >= 1400)
  tm result;
  localtime_s(&result, t);
  return result;
#else
  return *localtime(t);
#endif
#else
  tm result;
  return *localtime_r(t, &result);
#endif
}